

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicTriangleFillCoverCase::~BasicTriangleFillCoverCase
          (BasicTriangleFillCoverCase *this)

{
  BasicVariousTessLevelsPosAttrCase::~BasicVariousTessLevelsPosAttrCase
            (&this->super_BasicVariousTessLevelsPosAttrCase);
  operator_delete(this,0xb0);
  return;
}

Assistant:

BasicTriangleFillCoverCase (Context& context, const char* name, const char* description, TessPrimitiveType primitiveType, SpacingMode spacing, const char* referenceImagePathPrefix)
		: BasicVariousTessLevelsPosAttrCase (context, name, description, primitiveType, spacing, referenceImagePathPrefix)
	{
		DE_ASSERT(primitiveType == TESSPRIMITIVETYPE_TRIANGLES || primitiveType == TESSPRIMITIVETYPE_QUADS);
	}